

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  cmMakefile *pcVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  cmGeneratorTarget *this_01;
  bool bVar2;
  cmGlobalGenerator *this_02;
  cmake *this_03;
  reference ppcVar3;
  set<cmSourceFile_const*,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_04;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_05;
  cmGeneratorTarget *target;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *psVar4;
  iterator __first;
  pointer pcVar5;
  undefined1 local_1a0 [8];
  unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_> tg;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  depVisited;
  cmTargetDepend *d;
  iterator __end2;
  iterator __begin2;
  TargetDependSet *__range2;
  TargetDependSet *deps;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *gtVisited;
  cmGeneratorTarget *gt;
  iterator __end1;
  iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  cmGlobalUnixMakefileGenerator3 *gg;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmLocalUnixMakefileGenerator3 *local_10;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  this_02 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
  this_03 = cmGlobalGenerator::GetCMakeInstance(this_02);
  bVar2 = cmake::GetIsInTryCompile(this_03);
  if (!bVar2) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_COLOR_MAKEFILE",&local_31);
    bVar2 = cmMakefile::IsSet(pcVar1,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
    if (bVar2) {
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CMAKE_COLOR_MAKEFILE",&local_69);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
      this->ColorMakefile = bVar2;
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else {
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"CMAKE_COLOR_DIAGNOSTICS",&local_91);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_90);
      this->ColorMakefile = bVar2;
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES",&local_b9);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_b8);
  this->SkipPreprocessedSourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES",
             (allocator<char> *)((long)&gg + 7));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_e0);
  this->SkipAssemblySourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gg + 7));
  this_00 = (cmGlobalUnixMakefileGenerator3 *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1,
             (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
             (cmLocalGenerator *)this);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1
                     );
  gt = (cmGeneratorTarget *)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                     *)&gt), bVar2) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    this_01 = *ppcVar3;
    bVar2 = cmGeneratorTarget::IsInBuildSystem(this_01);
    if (bVar2) {
      this_04 = (set<cmSourceFile_const*,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 *)GetCommandsVisited(this,this_01);
      this_05 = &cmGlobalGenerator::GetTargetDirectDepends
                           ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            GlobalGenerator,this_01)->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
      ;
      __end2 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               ::begin(this_05);
      d = (cmTargetDepend *)
          std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                    (this_05);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&d), bVar2) {
        depVisited._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end2);
        target = cmTargetDepend::operator_cast_to_cmGeneratorTarget_
                           ((cmTargetDepend *)
                            depVisited._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar4 = GetCommandsVisited(this,target);
        std::
        set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
        ::set((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
               *)&stack0xfffffffffffffe78,psVar4);
        __first = std::
                  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                  ::begin((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                           *)&stack0xfffffffffffffe78);
        tg._M_t.
        super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
        .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
              )std::
               set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
               ::end((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                      *)&stack0xfffffffffffffe78);
        std::
        set<cmSourceFile_const*,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
        ::insert<std::_Rb_tree_const_iterator<cmSourceFile_const*>>
                  (this_04,(_Rb_tree_const_iterator<const_cmSourceFile_*>)__first._M_node,
                   (_Rb_tree_const_iterator<const_cmSourceFile_*>)
                   tg._M_t.
                   super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
                   .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl);
        std::
        set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
        ::~set((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *)&stack0xfffffffffffffe78);
        std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end2);
      }
      cmMakefileTargetGenerator::New((cmMakefileTargetGenerator *)local_1a0,this_01);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_1a0);
      if (bVar2) {
        pcVar5 = std::
                 unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                 ::operator->((unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                               *)local_1a0);
        (*(pcVar5->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])();
        pcVar5 = std::
                 unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                 ::get((unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                        *)local_1a0);
        cmGlobalUnixMakefileGenerator3::RecordTargetProgress(this_00,pcVar5);
      }
      std::unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>::
      ~unique_ptr((unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                   *)local_1a0);
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1);
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    if (this->Makefile->IsSet("CMAKE_COLOR_MAKEFILE")) {
      this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
    } else {
      this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_DIAGNOSTICS");
    }
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (cmGeneratorTarget* gt :
       this->GlobalGenerator->GetLocalGeneratorTargetsInOrder(this)) {
    if (!gt->IsInBuildSystem()) {
      continue;
    }

    auto& gtVisited = this->GetCommandsVisited(gt);
    const auto& deps = this->GlobalGenerator->GetTargetDirectDepends(gt);
    for (const auto& d : deps) {
      // Take the union of visited source files of custom commands
      auto depVisited = this->GetCommandsVisited(d);
      gtVisited.insert(depVisited.begin(), depVisited.end());
    }

    std::unique_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(gt));
    if (tg) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}